

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int check_token_segment(Context_conflict *ctx,char *str)

{
  int iVar1;
  size_t __n;
  size_t len;
  char *str_local;
  Context_conflict *ctx_local;
  
  __n = strlen(str);
  if ((__n <= ctx->tokenlen) && (iVar1 = strncasecmp(ctx->token,str,__n), iVar1 == 0)) {
    ctx->token = ctx->token + __n;
    ctx->tokenlen = ctx->tokenlen - (int)__n;
    return 1;
  }
  return 0;
}

Assistant:

static int check_token_segment(Context *ctx, const char *str)
{
    // !!! FIXME: these are case-insensitive, right?
    const size_t len = strlen(str);
    if ( (ctx->tokenlen < len) || (strncasecmp(ctx->token, str, len) != 0) )
        return 0;
    ctx->token += len;
    ctx->tokenlen -= len;
    return 1;
}